

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmProjectCommand.cxx
# Opt level: O2

bool __thiscall
cmProjectCommand::InitialPass
          (cmProjectCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  cmMakefile *pcVar1;
  pointer pbVar2;
  bool bVar3;
  bool bVar4;
  size_type sVar5;
  code *pcVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  PolicyStatus PVar11;
  int iVar12;
  string *psVar13;
  char *pcVar14;
  ostream *poVar15;
  PolicyID id;
  ulong uVar16;
  string *psVar17;
  long lVar18;
  cmCommand *pcVar19;
  string *i;
  _Alloc_hider name;
  allocator<char> local_3f9;
  cmCommand *local_3f8;
  string *local_3f0;
  string vv;
  _Any_data local_3c8;
  code *local_3b8;
  code *pcStack_3b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a8;
  anon_class_8_1_0e9793f7 resetReporter;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  languages;
  string vs;
  uint v [4];
  string extraInclude;
  char local_2d8 [64];
  char local_298 [64];
  char local_258 [184];
  string homepage;
  string description;
  string version;
  string srcdir;
  string bindir;
  RegularExpression vx;
  
  psVar17 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if (psVar17 ==
      (args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&extraInclude,"PROJECT called with incorrect number of arguments",
               (allocator<char> *)&vx);
    cmCommand::SetError(&this->super_cmCommand,&extraInclude);
    std::__cxx11::string::~string((string *)&extraInclude);
    return false;
  }
  cmMakefile::SetProjectName((this->super_cmCommand).Makefile,psVar17);
  std::__cxx11::string::string((string *)&bindir,(string *)psVar17);
  std::__cxx11::string::append((char *)&bindir);
  std::__cxx11::string::string((string *)&srcdir,(string *)psVar17);
  std::__cxx11::string::append((char *)&srcdir);
  pcVar1 = (this->super_cmCommand).Makefile;
  psVar13 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(pcVar1);
  cmMakefile::AddCacheDefinition
            (pcVar1,&bindir,(psVar13->_M_dataplus)._M_p,"Value Computed by CMake",STATIC,false);
  pcVar1 = (this->super_cmCommand).Makefile;
  psVar13 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(pcVar1);
  cmMakefile::AddCacheDefinition
            (pcVar1,&srcdir,(psVar13->_M_dataplus)._M_p,"Value Computed by CMake",STATIC,false);
  std::__cxx11::string::assign((char *)&bindir);
  std::__cxx11::string::assign((char *)&srcdir);
  pcVar1 = (this->super_cmCommand).Makefile;
  psVar13 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(pcVar1);
  cmMakefile::AddDefinition(pcVar1,&bindir,(psVar13->_M_dataplus)._M_p);
  pcVar1 = (this->super_cmCommand).Makefile;
  psVar13 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(pcVar1);
  cmMakefile::AddDefinition(pcVar1,&srcdir,(psVar13->_M_dataplus)._M_p);
  pcVar1 = (this->super_cmCommand).Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&extraInclude,"PROJECT_NAME",(allocator<char> *)&vx);
  cmMakefile::AddDefinition(pcVar1,&extraInclude,(psVar17->_M_dataplus)._M_p);
  local_3f0 = psVar17;
  std::__cxx11::string::~string((string *)&extraInclude);
  pcVar1 = (this->super_cmCommand).Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&extraInclude,"CMAKE_PROJECT_NAME",(allocator<char> *)&vx);
  pcVar14 = cmMakefile::GetDefinition(pcVar1,&extraInclude);
  if (pcVar14 == (char *)0x0) {
    std::__cxx11::string::~string((string *)&extraInclude);
LAB_0027579d:
    pcVar1 = (this->super_cmCommand).Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&extraInclude,"CMAKE_PROJECT_NAME",(allocator<char> *)&vx);
    psVar17 = local_3f0;
    cmMakefile::AddDefinition(pcVar1,&extraInclude,(local_3f0->_M_dataplus)._M_p);
    std::__cxx11::string::~string((string *)&extraInclude);
    pcVar1 = (this->super_cmCommand).Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&extraInclude,"CMAKE_PROJECT_NAME",(allocator<char> *)&vx);
    cmMakefile::AddCacheDefinition
              (pcVar1,&extraInclude,(psVar17->_M_dataplus)._M_p,"Value Computed by CMake",STATIC,
               false);
    std::__cxx11::string::~string((string *)&extraInclude);
  }
  else {
    bVar7 = cmMakefile::IsRootMakefile((this->super_cmCommand).Makefile);
    std::__cxx11::string::~string((string *)&extraInclude);
    if (bVar7) goto LAB_0027579d;
  }
  version._M_dataplus._M_p = (pointer)&version.field_2;
  version._M_string_length = 0;
  description._M_dataplus._M_p = (pointer)&description.field_2;
  description._M_string_length = 0;
  homepage._M_dataplus._M_p = (pointer)&homepage.field_2;
  homepage._M_string_length = 0;
  version.field_2._M_local_buf[0] = '\0';
  description.field_2._M_local_buf[0] = '\0';
  bVar9 = false;
  homepage.field_2._M_local_buf[0] = '\0';
  languages.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  languages.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  languages.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  resetReporter.missedValueReporter = (function<void_()> *)&local_3c8;
  local_3b8 = (code *)0x0;
  pcStack_3b0 = (code *)0x0;
  local_3c8._M_unused._M_object = (cmCommand *)0x0;
  local_3c8._8_8_ = (anon_class_8_1_0e9793f7 *)0x0;
  iVar12 = 2;
  lVar18 = 0x20;
  psVar17 = &extraInclude;
  bVar4 = false;
  bVar3 = false;
  bVar10 = false;
  bVar7 = false;
  uVar16 = 1;
  local_3f8 = &this->super_cmCommand;
  for (; pcVar19 = local_3f8,
      pbVar2 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start,
      uVar16 < (ulong)((long)(args->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 >> 5);
      uVar16 = uVar16 + 1) {
    bVar8 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&(pbVar2->_M_dataplus)._M_p + lVar18),"LANGUAGES");
    if (bVar8) {
      if (bVar10) {
        pcVar1 = local_3f8->Makefile;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&extraInclude,"LANGUAGES may be specified at most once.",
                   (allocator<char> *)&vx);
        cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&extraInclude);
        goto LAB_002768c2;
      }
      if (local_3b8 != (code *)0x0) {
        std::function<void_()>::operator()((function<void_()> *)&local_3c8);
      }
      bVar10 = true;
      if (languages.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          languages.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)psVar17,
                   "the following parameters must be specified after LANGUAGES keyword: ",
                   (allocator<char> *)&vx);
        cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                  ((string *)&vx,&languages,", ");
        std::__cxx11::string::append((string *)psVar17);
        std::__cxx11::string::~string((string *)&vx);
        std::__cxx11::string::push_back((char)psVar17);
        cmMakefile::IssueMessage(local_3f8->Makefile,WARNING,psVar17);
        std::__cxx11::string::~string((string *)psVar17);
      }
LAB_002759ac:
      iVar12 = 2;
    }
    else {
      bVar8 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((long)&(((args->
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                      _M_p + lVar18),"VERSION");
      if (bVar8) {
        if (bVar7) {
          pcVar1 = local_3f8->Makefile;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&extraInclude,"VERSION may be specified at most once.",
                     (allocator<char> *)&vx);
          cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&extraInclude);
          goto LAB_002768c2;
        }
        if (local_3b8 == (code *)0x0) {
          extraInclude.field_2._M_allocated_capacity = (size_type)(code *)0x0;
        }
        else {
          std::function<void_()>::operator()((function<void_()> *)&local_3c8);
          extraInclude.field_2._M_allocated_capacity = (size_type)local_3b8;
        }
        extraInclude._M_dataplus._M_p = (pointer)local_3c8._M_unused._0_8_;
        extraInclude._M_string_length = local_3c8._8_8_;
        local_3c8._M_unused._M_function_pointer = (_func_void *)local_3f8;
        local_3c8._8_8_ = &resetReporter;
        local_3b8 = std::
                    _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmProjectCommand.cxx:123:29)>
                    ::_M_manager;
        extraInclude.field_2._8_8_ = pcStack_3b0;
        pcStack_3b0 = std::
                      _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmProjectCommand.cxx:123:29)>
                      ::_M_invoke;
        std::_Function_base::~_Function_base((_Function_base *)psVar17);
        bVar7 = true;
        iVar12 = 3;
      }
      else {
        bVar8 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )((long)&(((args->
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)
                                         ._M_p + lVar18),"DESCRIPTION");
        if (bVar8) {
          if (bVar3) {
            pcVar1 = local_3f8->Makefile;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&extraInclude,"DESCRIPTION may be specified at most once.",
                       (allocator<char> *)&vx);
            cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&extraInclude);
            goto LAB_002768c2;
          }
          if (local_3b8 == (code *)0x0) {
            extraInclude.field_2._M_allocated_capacity = (size_type)(code *)0x0;
          }
          else {
            std::function<void_()>::operator()((function<void_()> *)&local_3c8);
            extraInclude.field_2._M_allocated_capacity = (size_type)local_3b8;
          }
          extraInclude._M_dataplus._M_p = (pointer)local_3c8._M_unused._0_8_;
          extraInclude._M_string_length = local_3c8._8_8_;
          local_3c8._M_unused._M_function_pointer = (_func_void *)local_3f8;
          local_3c8._8_8_ = &resetReporter;
          local_3b8 = std::
                      _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmProjectCommand.cxx:143:29)>
                      ::_M_manager;
          extraInclude.field_2._8_8_ = pcStack_3b0;
          pcStack_3b0 = std::
                        _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmProjectCommand.cxx:143:29)>
                        ::_M_invoke;
          std::_Function_base::~_Function_base((_Function_base *)psVar17);
          bVar3 = true;
          iVar12 = 0;
        }
        else {
          bVar8 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)((long)&(((args->
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               )._M_impl.super__Vector_impl_data._M_start)->
                                             _M_dataplus)._M_p + lVar18),"HOMEPAGE_URL");
          pcVar6 = local_3b8;
          if (bVar8) {
            if (bVar4) {
              pcVar1 = local_3f8->Makefile;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&extraInclude,"HOMEPAGE_URL may be specified at most once.",
                         (allocator<char> *)&vx);
              cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&extraInclude);
              goto LAB_002768c2;
            }
            extraInclude._M_dataplus._M_p = (pointer)local_3c8._M_unused._0_8_;
            extraInclude._M_string_length = local_3c8._8_8_;
            local_3c8._M_unused._M_function_pointer = (_func_void *)local_3f8;
            local_3c8._8_8_ = &resetReporter;
            local_3b8 = std::
                        _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmProjectCommand.cxx:160:29)>
                        ::_M_manager;
            extraInclude.field_2._M_allocated_capacity = (size_type)pcVar6;
            extraInclude.field_2._8_8_ = pcStack_3b0;
            pcStack_3b0 = std::
                          _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmProjectCommand.cxx:160:29)>
                          ::_M_invoke;
            std::_Function_base::~_Function_base((_Function_base *)psVar17);
            bVar4 = true;
            iVar12 = 1;
          }
          else {
            if ((uVar16 != 1) ||
               (bVar8 = std::operator==((args->
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start + 1,
                                        "__CMAKE_INJECTED_PROJECT_COMMAND__"), !bVar8)) {
              if (iVar12 == 0) {
                std::__cxx11::string::_M_assign((string *)&description);
              }
              else if (iVar12 == 1) {
                std::__cxx11::string::_M_assign((string *)&homepage);
              }
              else {
                if (iVar12 != 3) {
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::push_back(&languages,
                              (value_type *)
                              ((long)&(((args->
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                      _M_p + lVar18));
                  iVar12 = 2;
                  goto LAB_00275b2b;
                }
                std::__cxx11::string::_M_assign((string *)&version);
              }
              InitialPass::anon_class_8_1_0e9793f7::operator()(&resetReporter);
              goto LAB_002759ac;
            }
            bVar9 = true;
          }
        }
      }
    }
LAB_00275b2b:
    lVar18 = lVar18 + 0x20;
  }
  if (local_3b8 != (code *)0x0) {
    std::function<void_()>::operator()((function<void_()> *)&local_3c8);
  }
  if (((bVar7) || (bVar3)) || (bVar4)) {
    if (bVar10) goto LAB_00275c88;
    if (languages.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        languages.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) goto LAB_00275d84;
    pcVar1 = pcVar19->Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&extraInclude,
               "project with VERSION, DESCRIPTION or HOMEPAGE_URL must use LANGUAGES before language names."
               ,(allocator<char> *)&vx);
    cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&extraInclude);
LAB_002768c2:
    std::__cxx11::string::~string((string *)&extraInclude);
    cmSystemTools::s_FatalErrorOccured = true;
    bVar7 = true;
  }
  else {
    if (bVar10) {
LAB_00275c88:
      if (languages.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          languages.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[5]>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&languages,
                   (char (*) [5])0x4b76b9);
      }
    }
LAB_00275d84:
    PVar11 = cmMakefile::GetPolicyStatus(pcVar19->Makefile,CMP0048,false);
    if (bVar7) {
      if (PVar11 < NEW) {
        pcVar1 = pcVar19->Makefile;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&extraInclude,"VERSION not allowed unless CMP0048 is set to NEW",
                   (allocator<char> *)&vx);
        cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&extraInclude);
        goto LAB_002768c2;
      }
      cmsys::RegularExpression::RegularExpression
                (&vx,"^([0-9]+(\\.[0-9]+(\\.[0-9]+(\\.[0-9]+)?)?)?)?$");
      bVar10 = cmsys::RegularExpression::find(&vx,version._M_dataplus._M_p);
      if (bVar10) {
        vs._M_dataplus._M_p = (pointer)&vs.field_2;
        vs._M_string_length = 0;
        vs.field_2._M_local_buf[0] = '\0';
        v[0] = 0;
        v[1] = 0;
        v[2] = 0;
        v[3] = 0;
        iVar12 = __isoc99_sscanf(version._M_dataplus._M_p,"%u.%u.%u.%u",v,v + 1,v + 2,v + 3);
        for (lVar18 = 0; psVar13 = local_3f0, lVar18 != 4; lVar18 = lVar18 + 1) {
          if (lVar18 < iVar12) {
            sprintf((char *)psVar17,"%u",(ulong)v[lVar18]);
            std::__cxx11::string::append((char *)&vs);
            std::__cxx11::string::append((char *)&vs);
          }
          else {
            *(undefined1 *)&(psVar17->_M_dataplus)._M_p = 0;
          }
          psVar17 = psVar17 + 2;
        }
        vv._M_dataplus._M_p = (pointer)&vv.field_2;
        vv._M_string_length = 0;
        vv.field_2._M_allocated_capacity = vv.field_2._M_allocated_capacity & 0xffffffffffffff00;
        std::operator+(&local_3a8,local_3f0,"_VERSION");
        std::__cxx11::string::operator=((string *)&vv,(string *)&local_3a8);
        std::__cxx11::string::~string((string *)&local_3a8);
        pcVar19 = local_3f8;
        pcVar1 = local_3f8->Makefile;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_3a8,"PROJECT_VERSION",&local_3f9);
        cmMakefile::AddDefinition(pcVar1,&local_3a8,vs._M_dataplus._M_p);
        std::__cxx11::string::~string((string *)&local_3a8);
        cmMakefile::AddDefinition(pcVar19->Makefile,&vv,vs._M_dataplus._M_p);
        std::operator+(&local_3a8,psVar13,"_VERSION_MAJOR");
        std::__cxx11::string::operator=((string *)&vv,(string *)&local_3a8);
        std::__cxx11::string::~string((string *)&local_3a8);
        pcVar1 = pcVar19->Makefile;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_3a8,"PROJECT_VERSION_MAJOR",&local_3f9);
        cmMakefile::AddDefinition(pcVar1,&local_3a8,(char *)&extraInclude);
        std::__cxx11::string::~string((string *)&local_3a8);
        cmMakefile::AddDefinition(pcVar19->Makefile,&vv,(char *)&extraInclude);
        std::operator+(&local_3a8,psVar13,"_VERSION_MINOR");
        std::__cxx11::string::operator=((string *)&vv,(string *)&local_3a8);
        std::__cxx11::string::~string((string *)&local_3a8);
        pcVar1 = pcVar19->Makefile;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_3a8,"PROJECT_VERSION_MINOR",&local_3f9);
        cmMakefile::AddDefinition(pcVar1,&local_3a8,local_2d8);
        std::__cxx11::string::~string((string *)&local_3a8);
        cmMakefile::AddDefinition(pcVar19->Makefile,&vv,local_2d8);
        std::operator+(&local_3a8,psVar13,"_VERSION_PATCH");
        std::__cxx11::string::operator=((string *)&vv,(string *)&local_3a8);
        std::__cxx11::string::~string((string *)&local_3a8);
        pcVar1 = pcVar19->Makefile;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_3a8,"PROJECT_VERSION_PATCH",&local_3f9);
        cmMakefile::AddDefinition(pcVar1,&local_3a8,local_298);
        std::__cxx11::string::~string((string *)&local_3a8);
        cmMakefile::AddDefinition(pcVar19->Makefile,&vv,local_298);
        std::operator+(&local_3a8,psVar13,"_VERSION_TWEAK");
        std::__cxx11::string::operator=((string *)&vv,(string *)&local_3a8);
        std::__cxx11::string::~string((string *)&local_3a8);
        pcVar1 = pcVar19->Makefile;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_3a8,"PROJECT_VERSION_TWEAK",&local_3f9);
        cmMakefile::AddDefinition(pcVar1,&local_3a8,local_258);
        std::__cxx11::string::~string((string *)&local_3a8);
        pcVar19 = local_3f8;
        cmMakefile::AddDefinition(local_3f8->Makefile,&vv,local_258);
        TopLevelCMakeVarCondSet
                  ((cmProjectCommand *)pcVar19,"CMAKE_PROJECT_VERSION",vs._M_dataplus._M_p);
        TopLevelCMakeVarCondSet
                  ((cmProjectCommand *)pcVar19,"CMAKE_PROJECT_VERSION_MAJOR",(char *)&extraInclude);
        TopLevelCMakeVarCondSet((cmProjectCommand *)pcVar19,"CMAKE_PROJECT_VERSION_MINOR",local_2d8)
        ;
        TopLevelCMakeVarCondSet((cmProjectCommand *)pcVar19,"CMAKE_PROJECT_VERSION_PATCH",local_298)
        ;
        TopLevelCMakeVarCondSet((cmProjectCommand *)pcVar19,"CMAKE_PROJECT_VERSION_TWEAK",local_258)
        ;
        std::__cxx11::string::~string((string *)&vv);
        psVar17 = &vs;
      }
      else {
        std::operator+(&vs,"VERSION \"",&version);
        std::operator+(&extraInclude,&vs,"\" format invalid.");
        std::__cxx11::string::~string((string *)&vs);
        cmMakefile::IssueMessage(pcVar19->Makefile,FATAL_ERROR,&extraInclude);
        cmSystemTools::s_FatalErrorOccured = true;
        psVar17 = &extraInclude;
      }
      std::__cxx11::string::~string((string *)psVar17);
      cmsys::RegularExpression::~RegularExpression(&vx);
      bVar7 = true;
      if (!bVar10) goto LAB_002768dc;
    }
    else if (PVar11 != OLD) {
      vv._M_dataplus._M_p = (pointer)0x0;
      vv._M_string_length = 0;
      vv.field_2._M_allocated_capacity = 0;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[16]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&vv,
                 (char (*) [16])0x473acb);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[22]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&vv,
                 (char (*) [22])0x473ae1);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[22]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&vv,
                 (char (*) [22])0x473afd);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[22]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&vv,
                 (char (*) [22])0x473b19);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[22]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&vv,
                 (char (*) [22])0x473b35);
      std::operator+(&extraInclude,local_3f0,"_VERSION");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&vv,
                 &extraInclude);
      std::__cxx11::string::~string((string *)&extraInclude);
      std::operator+(&extraInclude,local_3f0,"_VERSION_MAJOR");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&vv,
                 &extraInclude);
      std::__cxx11::string::~string((string *)&extraInclude);
      std::operator+(&extraInclude,local_3f0,"_VERSION_MINOR");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&vv,
                 &extraInclude);
      std::__cxx11::string::~string((string *)&extraInclude);
      std::operator+(&extraInclude,local_3f0,"_VERSION_PATCH");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&vv,
                 &extraInclude);
      std::__cxx11::string::~string((string *)&extraInclude);
      std::operator+(&extraInclude,local_3f0,"_VERSION_TWEAK");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&vv,
                 &extraInclude);
      std::__cxx11::string::~string((string *)&extraInclude);
      bVar7 = cmMakefile::IsRootMakefile(pcVar19->Makefile);
      if (bVar7) {
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[22]>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&vv,
                   (char (*) [22])"CMAKE_PROJECT_VERSION");
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[28]>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&vv,
                   (char (*) [28])"CMAKE_PROJECT_VERSION_MAJOR");
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[28]>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&vv,
                   (char (*) [28])"CMAKE_PROJECT_VERSION_MINOR");
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[28]>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&vv,
                   (char (*) [28])"CMAKE_PROJECT_VERSION_PATCH");
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[28]>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&vv,
                   (char (*) [28])"CMAKE_PROJECT_VERSION_TWEAK");
      }
      sVar5 = vv._M_string_length;
      vx.regmatch.startp[0] = (char *)(vx.regmatch.startp + 2);
      vx.regmatch.startp[1] = (char *)0x0;
      vx.regmatch.startp[2]._0_1_ = 0;
      for (name._M_p = vv._M_dataplus._M_p; pcVar19 = local_3f8, name._M_p != (pointer)sVar5;
          name._M_p = name._M_p + 0x20) {
        pcVar14 = cmMakefile::GetDefinition(local_3f8->Makefile,(string *)name._M_p);
        if ((pcVar14 != (char *)0x0) && (*pcVar14 != '\0')) {
          if (PVar11 == WARN) {
            if (!bVar9) {
              std::__cxx11::string::append((char *)&vx);
              std::__cxx11::string::append((string *)&vx);
            }
          }
          else {
            cmMakefile::AddDefinition(local_3f8->Makefile,(string *)name._M_p,"");
          }
        }
      }
      if (vx.regmatch.startp[1] != (char *)0x0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&extraInclude);
        cmPolicies::GetPolicyWarning_abi_cxx11_(&vs,(cmPolicies *)0x30,id);
        poVar15 = std::operator<<((ostream *)&extraInclude,(string *)&vs);
        poVar15 = std::operator<<(poVar15,"\nThe following variable(s) would be set to empty:");
        std::operator<<(poVar15,(string *)&vx);
        std::__cxx11::string::~string((string *)&vs);
        pcVar1 = pcVar19->Makefile;
        std::__cxx11::stringbuf::str();
        cmMakefile::IssueMessage(pcVar1,AUTHOR_WARNING,&vs);
        std::__cxx11::string::~string((string *)&vs);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&extraInclude);
      }
      std::__cxx11::string::~string((string *)&vx);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&vv);
    }
    pcVar1 = pcVar19->Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&extraInclude,"PROJECT_DESCRIPTION",(allocator<char> *)&vx);
    cmMakefile::AddDefinition(pcVar1,&extraInclude,description._M_dataplus._M_p);
    psVar17 = local_3f0;
    std::__cxx11::string::~string((string *)&extraInclude);
    pcVar1 = pcVar19->Makefile;
    std::operator+(&extraInclude,psVar17,"_DESCRIPTION");
    cmMakefile::AddDefinition(pcVar1,&extraInclude,description._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&extraInclude);
    TopLevelCMakeVarCondSet
              ((cmProjectCommand *)pcVar19,"CMAKE_PROJECT_DESCRIPTION",description._M_dataplus._M_p)
    ;
    pcVar1 = pcVar19->Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&extraInclude,"PROJECT_HOMEPAGE_URL",(allocator<char> *)&vx);
    cmMakefile::AddDefinition(pcVar1,&extraInclude,homepage._M_dataplus._M_p);
    psVar17 = local_3f0;
    std::__cxx11::string::~string((string *)&extraInclude);
    pcVar1 = pcVar19->Makefile;
    std::operator+(&extraInclude,psVar17,"_HOMEPAGE_URL");
    cmMakefile::AddDefinition(pcVar1,&extraInclude,homepage._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&extraInclude);
    TopLevelCMakeVarCondSet
              ((cmProjectCommand *)pcVar19,"CMAKE_PROJECT_HOMEPAGE_URL",homepage._M_dataplus._M_p);
    if (languages.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        languages.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[2]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&languages,
                 (char (*) [2])0x44f27d);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[4]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&languages,
                 (char (*) [4])0x45b9af);
    }
    cmMakefile::EnableLanguage(pcVar19->Makefile,&languages,false);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vx,
                   "CMAKE_PROJECT_",local_3f0);
    std::operator+(&extraInclude,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vx,
                   "_INCLUDE");
    std::__cxx11::string::~string((string *)&vx);
    pcVar14 = cmMakefile::GetDefinition(pcVar19->Makefile,&extraInclude);
    bVar7 = true;
    if (pcVar14 != (char *)0x0) {
      pcVar1 = pcVar19->Makefile;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&vx,pcVar14,(allocator<char> *)&vs);
      bVar10 = cmMakefile::ReadDependentFile(pcVar1,(string *)&vx,true);
      std::__cxx11::string::~string((string *)&vx);
      if ((!bVar10) && (bVar10 = cmSystemTools::GetFatalErrorOccured(), !bVar10)) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&vx,"could not find file:\n  ",(allocator<char> *)&vs);
        std::__cxx11::string::append((char *)&vx);
        cmCommand::SetError(pcVar19,(string *)&vx);
        std::__cxx11::string::~string((string *)&vx);
        bVar7 = false;
      }
    }
    std::__cxx11::string::~string((string *)&extraInclude);
  }
LAB_002768dc:
  std::_Function_base::~_Function_base((_Function_base *)&local_3c8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&languages);
  std::__cxx11::string::~string((string *)&homepage);
  std::__cxx11::string::~string((string *)&description);
  std::__cxx11::string::~string((string *)&version);
  std::__cxx11::string::~string((string *)&srcdir);
  std::__cxx11::string::~string((string *)&bindir);
  return bVar7;
}

Assistant:

bool cmProjectCommand::InitialPass(std::vector<std::string> const& args,
                                   cmExecutionStatus&)
{
  if (args.empty()) {
    this->SetError("PROJECT called with incorrect number of arguments");
    return false;
  }

  std::string const& projectName = args[0];

  this->Makefile->SetProjectName(projectName);

  std::string bindir = projectName;
  bindir += "_BINARY_DIR";
  std::string srcdir = projectName;
  srcdir += "_SOURCE_DIR";

  this->Makefile->AddCacheDefinition(
    bindir, this->Makefile->GetCurrentBinaryDirectory().c_str(),
    "Value Computed by CMake", cmStateEnums::STATIC);
  this->Makefile->AddCacheDefinition(
    srcdir, this->Makefile->GetCurrentSourceDirectory().c_str(),
    "Value Computed by CMake", cmStateEnums::STATIC);

  bindir = "PROJECT_BINARY_DIR";
  srcdir = "PROJECT_SOURCE_DIR";

  this->Makefile->AddDefinition(
    bindir, this->Makefile->GetCurrentBinaryDirectory().c_str());
  this->Makefile->AddDefinition(
    srcdir, this->Makefile->GetCurrentSourceDirectory().c_str());

  this->Makefile->AddDefinition("PROJECT_NAME", projectName.c_str());

  // Set the CMAKE_PROJECT_NAME variable to be the highest-level
  // project name in the tree. If there are two project commands
  // in the same CMakeLists.txt file, and it is the top level
  // CMakeLists.txt file, then go with the last one, so that
  // CMAKE_PROJECT_NAME will match PROJECT_NAME, and cmake --build
  // will work.
  if (!this->Makefile->GetDefinition("CMAKE_PROJECT_NAME") ||
      (this->Makefile->IsRootMakefile())) {
    this->Makefile->AddDefinition("CMAKE_PROJECT_NAME", projectName.c_str());
    this->Makefile->AddCacheDefinition(
      "CMAKE_PROJECT_NAME", projectName.c_str(), "Value Computed by CMake",
      cmStateEnums::STATIC);
  }

  bool haveVersion = false;
  bool haveLanguages = false;
  bool haveDescription = false;
  bool haveHomepage = false;
  bool injectedProjectCommand = false;
  std::string version;
  std::string description;
  std::string homepage;
  std::vector<std::string> languages;
  std::function<void()> missedValueReporter;
  auto resetReporter = [&missedValueReporter]() {
    missedValueReporter = std::function<void()>();
  };
  enum Doing
  {
    DoingDescription,
    DoingHomepage,
    DoingLanguages,
    DoingVersion
  };
  Doing doing = DoingLanguages;
  for (size_t i = 1; i < args.size(); ++i) {
    if (args[i] == "LANGUAGES") {
      if (haveLanguages) {
        this->Makefile->IssueMessage(
          MessageType::FATAL_ERROR,
          "LANGUAGES may be specified at most once.");
        cmSystemTools::SetFatalErrorOccured();
        return true;
      }
      haveLanguages = true;
      if (missedValueReporter) {
        missedValueReporter();
      }
      doing = DoingLanguages;
      if (!languages.empty()) {
        std::string msg =
          "the following parameters must be specified after LANGUAGES "
          "keyword: ";
        msg += cmJoin(languages, ", ");
        msg += '.';
        this->Makefile->IssueMessage(MessageType::WARNING, msg);
      }
    } else if (args[i] == "VERSION") {
      if (haveVersion) {
        this->Makefile->IssueMessage(MessageType::FATAL_ERROR,
                                     "VERSION may be specified at most once.");
        cmSystemTools::SetFatalErrorOccured();
        return true;
      }
      haveVersion = true;
      if (missedValueReporter) {
        missedValueReporter();
      }
      doing = DoingVersion;
      missedValueReporter = [this, &resetReporter]() {
        this->Makefile->IssueMessage(
          MessageType::WARNING,
          "VERSION keyword not followed by a value or was followed by a "
          "value that expanded to nothing.");
        resetReporter();
      };
    } else if (args[i] == "DESCRIPTION") {
      if (haveDescription) {
        this->Makefile->IssueMessage(
          MessageType::FATAL_ERROR,
          "DESCRIPTION may be specified at most once.");
        cmSystemTools::SetFatalErrorOccured();
        return true;
      }
      haveDescription = true;
      if (missedValueReporter) {
        missedValueReporter();
      }
      doing = DoingDescription;
      missedValueReporter = [this, &resetReporter]() {
        this->Makefile->IssueMessage(
          MessageType::WARNING,
          "DESCRIPTION keyword not followed by a value or was followed "
          "by a value that expanded to nothing.");
        resetReporter();
      };
    } else if (args[i] == "HOMEPAGE_URL") {
      if (haveHomepage) {
        this->Makefile->IssueMessage(
          MessageType::FATAL_ERROR,
          "HOMEPAGE_URL may be specified at most once.");
        cmSystemTools::SetFatalErrorOccured();
        return true;
      }
      haveHomepage = true;
      doing = DoingHomepage;
      missedValueReporter = [this, &resetReporter]() {
        this->Makefile->IssueMessage(
          MessageType::WARNING,
          "HOMEPAGE_URL keyword not followed by a value or was followed "
          "by a value that expanded to nothing.");
        resetReporter();
      };
    } else if (i == 1 && args[i] == "__CMAKE_INJECTED_PROJECT_COMMAND__") {
      injectedProjectCommand = true;
    } else if (doing == DoingVersion) {
      doing = DoingLanguages;
      version = args[i];
      resetReporter();
    } else if (doing == DoingDescription) {
      doing = DoingLanguages;
      description = args[i];
      resetReporter();
    } else if (doing == DoingHomepage) {
      doing = DoingLanguages;
      homepage = args[i];
      resetReporter();
    } else // doing == DoingLanguages
    {
      languages.push_back(args[i]);
    }
  }

  if (missedValueReporter) {
    missedValueReporter();
  }

  if ((haveVersion || haveDescription || haveHomepage) && !haveLanguages &&
      !languages.empty()) {
    this->Makefile->IssueMessage(
      MessageType::FATAL_ERROR,
      "project with VERSION, DESCRIPTION or HOMEPAGE_URL must "
      "use LANGUAGES before language names.");
    cmSystemTools::SetFatalErrorOccured();
    return true;
  }
  if (haveLanguages && languages.empty()) {
    languages.emplace_back("NONE");
  }

  cmPolicies::PolicyStatus cmp0048 =
    this->Makefile->GetPolicyStatus(cmPolicies::CMP0048);
  if (haveVersion) {
    // Set project VERSION variables to given values
    if (cmp0048 == cmPolicies::OLD || cmp0048 == cmPolicies::WARN) {
      this->Makefile->IssueMessage(
        MessageType::FATAL_ERROR,
        "VERSION not allowed unless CMP0048 is set to NEW");
      cmSystemTools::SetFatalErrorOccured();
      return true;
    }

    cmsys::RegularExpression vx(
      "^([0-9]+(\\.[0-9]+(\\.[0-9]+(\\.[0-9]+)?)?)?)?$");
    if (!vx.find(version)) {
      std::string e = "VERSION \"" + version + "\" format invalid.";
      this->Makefile->IssueMessage(MessageType::FATAL_ERROR, e);
      cmSystemTools::SetFatalErrorOccured();
      return true;
    }

    std::string vs;
    const char* sep = "";
    char vb[4][64];
    unsigned int v[4] = { 0, 0, 0, 0 };
    int vc =
      sscanf(version.c_str(), "%u.%u.%u.%u", &v[0], &v[1], &v[2], &v[3]);
    for (int i = 0; i < 4; ++i) {
      if (i < vc) {
        sprintf(vb[i], "%u", v[i]);
        vs += sep;
        vs += vb[i];
        sep = ".";
      } else {
        vb[i][0] = 0;
      }
    }

    std::string vv;
    vv = projectName + "_VERSION";
    this->Makefile->AddDefinition("PROJECT_VERSION", vs.c_str());
    this->Makefile->AddDefinition(vv, vs.c_str());
    vv = projectName + "_VERSION_MAJOR";
    this->Makefile->AddDefinition("PROJECT_VERSION_MAJOR", vb[0]);
    this->Makefile->AddDefinition(vv, vb[0]);
    vv = projectName + "_VERSION_MINOR";
    this->Makefile->AddDefinition("PROJECT_VERSION_MINOR", vb[1]);
    this->Makefile->AddDefinition(vv, vb[1]);
    vv = projectName + "_VERSION_PATCH";
    this->Makefile->AddDefinition("PROJECT_VERSION_PATCH", vb[2]);
    this->Makefile->AddDefinition(vv, vb[2]);
    vv = projectName + "_VERSION_TWEAK";
    this->Makefile->AddDefinition("PROJECT_VERSION_TWEAK", vb[3]);
    this->Makefile->AddDefinition(vv, vb[3]);
    // Also, try set top level variables
    TopLevelCMakeVarCondSet("CMAKE_PROJECT_VERSION", vs.c_str());
    TopLevelCMakeVarCondSet("CMAKE_PROJECT_VERSION_MAJOR", vb[0]);
    TopLevelCMakeVarCondSet("CMAKE_PROJECT_VERSION_MINOR", vb[1]);
    TopLevelCMakeVarCondSet("CMAKE_PROJECT_VERSION_PATCH", vb[2]);
    TopLevelCMakeVarCondSet("CMAKE_PROJECT_VERSION_TWEAK", vb[3]);
  } else if (cmp0048 != cmPolicies::OLD) {
    // Set project VERSION variables to empty
    std::vector<std::string> vv;
    vv.emplace_back("PROJECT_VERSION");
    vv.emplace_back("PROJECT_VERSION_MAJOR");
    vv.emplace_back("PROJECT_VERSION_MINOR");
    vv.emplace_back("PROJECT_VERSION_PATCH");
    vv.emplace_back("PROJECT_VERSION_TWEAK");
    vv.push_back(projectName + "_VERSION");
    vv.push_back(projectName + "_VERSION_MAJOR");
    vv.push_back(projectName + "_VERSION_MINOR");
    vv.push_back(projectName + "_VERSION_PATCH");
    vv.push_back(projectName + "_VERSION_TWEAK");
    if (this->Makefile->IsRootMakefile()) {
      vv.emplace_back("CMAKE_PROJECT_VERSION");
      vv.emplace_back("CMAKE_PROJECT_VERSION_MAJOR");
      vv.emplace_back("CMAKE_PROJECT_VERSION_MINOR");
      vv.emplace_back("CMAKE_PROJECT_VERSION_PATCH");
      vv.emplace_back("CMAKE_PROJECT_VERSION_TWEAK");
    }
    std::string vw;
    for (std::string const& i : vv) {
      const char* v = this->Makefile->GetDefinition(i);
      if (v && *v) {
        if (cmp0048 == cmPolicies::WARN) {
          if (!injectedProjectCommand) {
            vw += "\n  ";
            vw += i;
          }
        } else {
          this->Makefile->AddDefinition(i, "");
        }
      }
    }
    if (!vw.empty()) {
      std::ostringstream w;
      w << cmPolicies::GetPolicyWarning(cmPolicies::CMP0048)
        << "\nThe following variable(s) would be set to empty:" << vw;
      this->Makefile->IssueMessage(MessageType::AUTHOR_WARNING, w.str());
    }
  }

  this->Makefile->AddDefinition("PROJECT_DESCRIPTION", description.c_str());
  this->Makefile->AddDefinition(projectName + "_DESCRIPTION",
                                description.c_str());
  TopLevelCMakeVarCondSet("CMAKE_PROJECT_DESCRIPTION", description.c_str());

  this->Makefile->AddDefinition("PROJECT_HOMEPAGE_URL", homepage.c_str());
  this->Makefile->AddDefinition(projectName + "_HOMEPAGE_URL",
                                homepage.c_str());
  TopLevelCMakeVarCondSet("CMAKE_PROJECT_HOMEPAGE_URL", homepage.c_str());

  if (languages.empty()) {
    // if no language is specified do c and c++
    languages.emplace_back("C");
    languages.emplace_back("CXX");
  }
  this->Makefile->EnableLanguage(languages, false);
  std::string extraInclude = "CMAKE_PROJECT_" + projectName + "_INCLUDE";
  const char* include = this->Makefile->GetDefinition(extraInclude);
  if (include) {
    bool readit = this->Makefile->ReadDependentFile(include);
    if (!readit && !cmSystemTools::GetFatalErrorOccured()) {
      std::string m = "could not find file:\n"
                      "  ";
      m += include;
      this->SetError(m);
      return false;
    }
  }
  return true;
}